

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O2

void __thiscall
QMdiSubWindowPrivate::updateWindowTitle(QMdiSubWindowPrivate *this,bool isRequestFromChild)

{
  Data *pDVar1;
  bool bVar2;
  QWidget *pQVar3;
  undefined7 in_register_00000031;
  QWidget *this_00;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> QStack_68;
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  this_00 = pQVar3;
  if ((int)CONCAT71(in_register_00000031,isRequestFromChild) != 0) {
    QWidget::windowTitle((QString *)&local_50,pQVar3);
    if ((local_50.size == 0) || ((this->lastChildWindowTitle).d.size == 0)) {
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    }
    else {
      QWidget::windowTitle((QString *)&QStack_68,pQVar3);
      bVar2 = ::operator!=(&this->lastChildWindowTitle,(QString *)&QStack_68);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_68);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
      if (bVar2) goto LAB_004196fc;
    }
    pDVar1 = (this->baseWidget).wp.d;
    if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) goto LAB_004196fc;
    this_00 = (QWidget *)(this->baseWidget).wp.value;
  }
  if (this_00 != (QWidget *)0x0) {
    QWidget::windowTitle((QString *)&local_50,this_00);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    if (local_50.size != 0) {
      this->ignoreWindowTitleChange = true;
      QWidget::windowTitle((QString *)&local_50,this_00);
      QWidget::setWindowTitle(pQVar3,(QString *)&local_50);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
      pQVar3 = QMdiSubWindow::maximizedButtonsWidget((QMdiSubWindow *)pQVar3);
      if (pQVar3 != (QWidget *)0x0) {
        setNewWindowTitle(this);
      }
      this->ignoreWindowTitleChange = false;
    }
  }
LAB_004196fc:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMdiSubWindowPrivate::updateWindowTitle(bool isRequestFromChild)
{
    Q_Q(QMdiSubWindow);
    if (isRequestFromChild && !q->windowTitle().isEmpty() && !lastChildWindowTitle.isEmpty()
            && lastChildWindowTitle != q->windowTitle()) {
        return;
    }

    QWidget *titleWidget = nullptr;
    if (isRequestFromChild)
        titleWidget = baseWidget;
    else
        titleWidget = q;
    if (!titleWidget || titleWidget->windowTitle().isEmpty())
        return;

    ignoreWindowTitleChange = true;
    q->setWindowTitle(titleWidget->windowTitle());
    if (q->maximizedButtonsWidget())
        setNewWindowTitle();
    ignoreWindowTitleChange = false;
}